

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int aux_close(lua_State *L)

{
  int iVar1;
  lua_CFunction p_Var2;
  lua_State *L_local;
  
  lua_getfenv(L,1);
  lua_getfield(L,-1,"__close");
  p_Var2 = lua_tocfunction(L,-1);
  iVar1 = (*p_Var2)(L);
  return iVar1;
}

Assistant:

static int aux_close(lua_State*L){
lua_getfenv(L,1);
lua_getfield(L,-1,"__close");
return(lua_tocfunction(L,-1))(L);
}